

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O0

char libcalc::symbolType(char symbol)

{
  bool bVar1;
  char local_f;
  short local_e;
  char local_9;
  short i;
  bool isValid;
  char symbol_local;
  
  bVar1 = false;
  local_e = 0;
  do {
    if (0x15 < local_e) {
LAB_0010919f:
      if (bVar1) {
        bVar1 = isOperator(symbol);
        local_f = '\x01';
        if (!bVar1) {
          local_f = '\x02';
        }
        local_9 = local_f;
      }
      else {
        local_9 = '\x03';
      }
      return local_9;
    }
    if (TOKEN_SYMBOLS[local_e] == symbol) {
      bVar1 = true;
      goto LAB_0010919f;
    }
    local_e = local_e + 1;
  } while( true );
}

Assistant:

const char symbolType(const char symbol) {
  bool isValid = false;

  for (short i = 0; i < TOKEN_SYMBOLS_LEN; i++) {
    if (TOKEN_SYMBOLS[i] == symbol) {
      isValid = true;
      break;
    }
  }

  if (isValid == false) {
    return TOKEN_TYPE.GARBAGE;
  }

  return isOperator(symbol) ? TOKEN_TYPE.OPERATOR : TOKEN_TYPE.SYMBOL;
}